

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# overlay.cpp
# Opt level: O0

void __thiscall r_exec::Overlay::load_code(Overlay *this)

{
  undefined1 auVar1 [16];
  int iVar2;
  Atom *this_00;
  Code *pCVar3;
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  undefined4 extraout_var;
  Atom *pAVar7;
  ulong uVar8;
  Atom *local_70;
  Code *object;
  Overlay *this_local;
  
  if ((this->code != (Atom *)0x0) && (pAVar7 = this->code, pAVar7 != (Atom *)0x0)) {
    this_00 = pAVar7 + *(long *)(pAVar7 + -8) * 4;
    while (pAVar7 != this_00) {
      this_00 = this_00 + -4;
      r_code::Atom::~Atom(this_00);
    }
    operator_delete__(pAVar7 + -8);
  }
  pCVar3 = get_core_object(this);
  iVar2 = (*(pCVar3->super__Object)._vptr__Object[6])();
  this->code_size = (uint16_t)iVar2;
  uVar4 = CONCAT62(0,this->code_size);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = uVar4;
  uVar5 = SUB168(auVar1 * ZEXT816(4),0);
  uVar8 = uVar5 + 8;
  if (SUB168(auVar1 * ZEXT816(4),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar8);
  *puVar6 = uVar4;
  pAVar7 = (Atom *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_70 = pAVar7;
    do {
      r_code::Atom::Atom(local_70,0xffffffff);
      local_70 = local_70 + 4;
    } while (local_70 != pAVar7 + uVar4 * 4);
  }
  this->code = pAVar7;
  pAVar7 = this->code;
  iVar2 = (*(pCVar3->super__Object)._vptr__Object[4])(pCVar3,0);
  memcpy(pAVar7,(void *)CONCAT44(extraout_var,iVar2),(ulong)this->code_size << 2);
  return;
}

Assistant:

void Overlay::load_code()
{
    if (code) {
        delete[] code;
    }

    Code *object = get_core_object();
    // copy the original pgm/hlp code.
    code_size = object->code_size();
    code = new r_code::Atom[code_size];
    memcpy(code, &object->code(0), code_size * sizeof(r_code::Atom));
}